

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_scan_sse2_128_16.c
# Opt level: O1

parasail_result_t *
parasail_sw_scan_profile_sse2_128_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  ushort *puVar1;
  short *psVar2;
  void *pvVar3;
  parasail_matrix_t *ppVar4;
  short sVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  parasail_result_t *ppVar9;
  __m128i *b;
  __m128i *ptr;
  __m128i *b_00;
  __m128i *__dest;
  __m128i *ptr_00;
  ulong uVar10;
  uint uVar11;
  int iVar12;
  __m128i *palVar13;
  ulong uVar14;
  int iVar15;
  undefined8 extraout_RDX;
  longlong extraout_RDX_00;
  long lVar16;
  long lVar17;
  uint uVar18;
  uint uVar19;
  ulong uVar20;
  ulong uVar21;
  undefined8 unaff_R15;
  ushort uVar22;
  short sVar23;
  short sVar24;
  ushort uVar25;
  undefined4 uVar26;
  ushort uVar44;
  ushort uVar47;
  ushort uVar50;
  ushort uVar51;
  ushort uVar52;
  undefined1 auVar28 [16];
  undefined4 uVar27;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  __m128i alVar33;
  ushort uVar41;
  ushort uVar53;
  undefined1 auVar34 [16];
  short sVar42;
  short sVar45;
  short sVar48;
  short sVar54;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  ushort uVar43;
  ushort uVar46;
  ushort uVar49;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  ushort uVar55;
  ushort uVar59;
  ushort uVar60;
  ushort uVar61;
  ushort uVar62;
  ushort uVar63;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar64 [16];
  ushort uVar65;
  ushort uVar66;
  ushort uVar67;
  ushort uVar68;
  ushort uVar69;
  ushort uVar70;
  ushort uVar71;
  ushort uVar72;
  undefined1 auVar73 [16];
  ushort uVar74;
  ushort uVar76;
  ushort uVar77;
  ushort uVar78;
  ushort uVar79;
  ushort uVar80;
  ushort uVar81;
  ushort uVar82;
  undefined1 auVar75 [16];
  ushort uVar83;
  ushort uVar84;
  ushort uVar85;
  ushort uVar86;
  ushort uVar87;
  ushort uVar88;
  ushort uVar89;
  ushort uVar90;
  ushort uVar91;
  ushort uVar92;
  ushort uVar93;
  ushort uVar94;
  ushort uVar95;
  ushort uVar96;
  ushort uVar97;
  ushort uVar98;
  __m128i c;
  uint local_144;
  ushort local_118;
  ushort uStack_116;
  ushort local_108;
  ushort uStack_106;
  ushort local_88;
  ushort uStack_86;
  size_t len;
  undefined1 auVar35 [16];
  short sVar56;
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sw_scan_profile_sse2_128_16_cold_8();
  }
  else {
    pvVar3 = (profile->profile16).score;
    if (pvVar3 == (void *)0x0) {
      parasail_sw_scan_profile_sse2_128_16_cold_7();
    }
    else {
      ppVar4 = profile->matrix;
      if (ppVar4 == (parasail_matrix_t *)0x0) {
        parasail_sw_scan_profile_sse2_128_16_cold_6();
      }
      else {
        uVar18 = profile->s1Len;
        uVar8 = (ulong)uVar18;
        if ((int)uVar18 < 1) {
          parasail_sw_scan_profile_sse2_128_16_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sw_scan_profile_sse2_128_16_cold_4();
        }
        else if (s2Len < 1) {
          parasail_sw_scan_profile_sse2_128_16_cold_3();
        }
        else if (open < 0) {
          parasail_sw_scan_profile_sse2_128_16_cold_2();
        }
        else if (gap < 0) {
          parasail_sw_scan_profile_sse2_128_16_cold_1();
        }
        else {
          iVar12 = ppVar4->min;
          iVar15 = -iVar12;
          if (iVar12 != -open && SBORROW4(iVar12,-open) == iVar12 + open < 0) {
            iVar15 = open;
          }
          iVar12 = ppVar4->max;
          ppVar9 = parasail_result_new();
          if (ppVar9 != (parasail_result_t *)0x0) {
            uVar20 = uVar8 + 7 >> 3;
            ppVar9->flag = ppVar9->flag | 0x8200404;
            b = parasail_memalign___m128i(0x10,uVar20);
            ptr = parasail_memalign___m128i(0x10,uVar20);
            b_00 = parasail_memalign___m128i(0x10,uVar20);
            __dest = parasail_memalign___m128i(0x10,uVar20);
            ptr_00 = parasail_memalign___m128i(0x10,uVar20);
            alVar33[1]._1_7_ = (undefined7)((ulong)extraout_RDX >> 8);
            alVar33[1]._0_1_ =
                 (__dest == (__m128i *)0x0 || b_00 == (__m128i *)0x0) ||
                 (ptr == (__m128i *)0x0 || b == (__m128i *)0x0);
            if (ptr_00 != (__m128i *)0x0 &&
                ((__dest != (__m128i *)0x0 && b_00 != (__m128i *)0x0) &&
                (ptr != (__m128i *)0x0 && b != (__m128i *)0x0))) {
              auVar28 = pshuflw(ZEXT416((uint)open),ZEXT416((uint)open),0);
              uVar26 = auVar28._0_4_;
              auVar28 = pshuflw(ZEXT416((uint)gap),ZEXT416((uint)gap),0);
              uVar27 = auVar28._0_4_;
              local_144 = iVar15 - 0x7fff;
              auVar29 = pshuflw(ZEXT416(local_144),ZEXT416(local_144),0);
              auVar28 = ZEXT416((uint)CONCAT62((int6)((ulong)unaff_R15 >> 0x10),
                                               0x7ffe - (short)iVar12));
              auVar30 = pshuflw(auVar28,auVar28,0);
              uVar7 = local_144 & 0xffff;
              uVar19 = (uint)uVar20;
              uVar11 = -(gap * uVar19);
              len = (size_t)uVar11;
              auVar28 = pshuflw(ZEXT416(uVar11),ZEXT416(uVar11),0);
              uVar11 = auVar28._0_4_;
              auVar32._0_8_ = CONCAT44(uVar11,uVar11);
              auVar32._8_4_ = uVar11;
              auVar32._12_4_ = uVar11;
              auVar31._0_8_ = auVar32._0_8_ << 0x10;
              auVar31._8_8_ = auVar32._8_8_ << 0x10 | (ulong)(uVar11 >> 0x10);
              auVar32 = paddsw(auVar31,ZEXT416(uVar7));
              alVar33[0] = uVar20;
              parasail_memset___m128i(b_00,alVar33,len);
              c[1] = extraout_RDX_00;
              c[0] = uVar20;
              parasail_memset___m128i(b,c,len);
              auVar28._4_4_ = uVar27;
              auVar28._0_4_ = uVar27;
              auVar28._8_4_ = uVar27;
              auVar28._12_4_ = uVar27;
              auVar73._4_4_ = uVar26;
              auVar73._0_4_ = uVar26;
              auVar73._8_4_ = uVar26;
              auVar73._12_4_ = uVar26;
              alVar33 = (__m128i)psubsw((undefined1  [16])0x0,auVar73);
              palVar13 = ptr_00 + (uVar19 - 1);
              uVar14 = uVar20;
              do {
                *palVar13 = alVar33;
                alVar33 = (__m128i)psubsw((undefined1  [16])alVar33,auVar28);
                palVar13 = palVar13 + -1;
                iVar12 = (int)uVar14;
                uVar11 = iVar12 - 1;
                uVar14 = (ulong)uVar11;
              } while (uVar11 != 0 && 0 < iVar12);
              uVar14 = 1;
              if (1 < s2Len) {
                uVar14 = (ulong)(uint)s2Len;
              }
              lVar17 = (ulong)(uVar19 + (uVar19 == 0)) << 4;
              uVar21 = 0;
              uVar10 = 0;
              local_118 = auVar29._0_2_;
              uStack_116 = auVar29._2_2_;
              local_88 = auVar30._0_2_;
              uStack_86 = auVar30._2_2_;
              uVar74 = local_118;
              uVar76 = uStack_116;
              uVar77 = local_118;
              uVar78 = uStack_116;
              uVar79 = local_118;
              uVar80 = uStack_116;
              uVar81 = local_118;
              uVar82 = uStack_116;
              local_108 = local_118;
              uStack_106 = uStack_116;
              uVar25 = local_118;
              uVar43 = uStack_116;
              uVar46 = local_118;
              uVar49 = uStack_116;
              uVar62 = local_118;
              uVar63 = uStack_116;
              uVar91 = local_118;
              uVar92 = uStack_116;
              uVar93 = local_118;
              uVar94 = uStack_116;
              uVar95 = local_118;
              uVar96 = uStack_116;
              uVar97 = local_118;
              uVar98 = uStack_116;
              uVar83 = local_88;
              uVar84 = uStack_86;
              uVar85 = local_88;
              uVar86 = uStack_86;
              uVar87 = local_88;
              uVar88 = uStack_86;
              uVar89 = local_88;
              uVar90 = uStack_86;
              do {
                iVar12 = ppVar4->mapper[(byte)s2[uVar21]];
                uVar6 = b_00[uVar19 - 1][0];
                auVar29._0_8_ = uVar6 << 0x10;
                auVar29._8_8_ = b_00[uVar19 - 1][1] << 0x10 | uVar6 >> 0x30;
                lVar16 = 0;
                auVar30 = (undefined1  [16])0x0;
                uVar22 = local_118;
                uVar41 = uStack_116;
                uVar44 = local_118;
                uVar47 = uStack_116;
                uVar50 = local_118;
                uVar51 = uStack_116;
                uVar52 = local_118;
                uVar53 = uStack_116;
                do {
                  auVar31 = *(undefined1 (*) [16])((long)*b_00 + lVar16);
                  auVar64 = paddsw(auVar29,*(undefined1 (*) [16])
                                            ((long)pvVar3 + lVar16 + (long)iVar12 * uVar20 * 0x10));
                  auVar29 = paddsw(auVar30,*(undefined1 (*) [16])((long)*ptr_00 + lVar16));
                  auVar30 = psubsw(*(undefined1 (*) [16])((long)*b + lVar16),auVar28);
                  sVar56 = auVar29._0_2_;
                  uVar22 = (ushort)((short)uVar22 < sVar56) * sVar56 |
                           ((short)uVar22 >= sVar56) * uVar22;
                  sVar56 = auVar29._2_2_;
                  uVar41 = (ushort)((short)uVar41 < sVar56) * sVar56 |
                           ((short)uVar41 >= sVar56) * uVar41;
                  sVar56 = auVar29._4_2_;
                  uVar44 = (ushort)((short)uVar44 < sVar56) * sVar56 |
                           ((short)uVar44 >= sVar56) * uVar44;
                  sVar56 = auVar29._6_2_;
                  uVar47 = (ushort)((short)uVar47 < sVar56) * sVar56 |
                           ((short)uVar47 >= sVar56) * uVar47;
                  sVar56 = auVar29._8_2_;
                  uVar50 = (ushort)((short)uVar50 < sVar56) * sVar56 |
                           ((short)uVar50 >= sVar56) * uVar50;
                  sVar56 = auVar29._10_2_;
                  uVar51 = (ushort)((short)uVar51 < sVar56) * sVar56 |
                           ((short)uVar51 >= sVar56) * uVar51;
                  sVar56 = auVar29._12_2_;
                  uVar52 = (ushort)((short)uVar52 < sVar56) * sVar56 |
                           ((short)uVar52 >= sVar56) * uVar52;
                  sVar56 = auVar29._14_2_;
                  uVar53 = (ushort)((short)uVar53 < sVar56) * sVar56 |
                           ((short)uVar53 >= sVar56) * uVar53;
                  auVar29 = psubsw(auVar31,auVar73);
                  sVar56 = auVar30._0_2_;
                  sVar24 = auVar29._0_2_;
                  uVar65 = (ushort)(sVar24 < sVar56) * sVar56 | (ushort)(sVar24 >= sVar56) * sVar24;
                  sVar56 = auVar30._2_2_;
                  sVar24 = auVar29._2_2_;
                  uVar66 = (ushort)(sVar24 < sVar56) * sVar56 | (ushort)(sVar24 >= sVar56) * sVar24;
                  sVar56 = auVar30._4_2_;
                  sVar24 = auVar29._4_2_;
                  uVar67 = (ushort)(sVar24 < sVar56) * sVar56 | (ushort)(sVar24 >= sVar56) * sVar24;
                  sVar56 = auVar30._6_2_;
                  sVar24 = auVar29._6_2_;
                  uVar68 = (ushort)(sVar24 < sVar56) * sVar56 | (ushort)(sVar24 >= sVar56) * sVar24;
                  sVar56 = auVar30._8_2_;
                  sVar24 = auVar29._8_2_;
                  uVar69 = (ushort)(sVar24 < sVar56) * sVar56 | (ushort)(sVar24 >= sVar56) * sVar24;
                  sVar56 = auVar30._10_2_;
                  sVar24 = auVar29._10_2_;
                  uVar70 = (ushort)(sVar24 < sVar56) * sVar56 | (ushort)(sVar24 >= sVar56) * sVar24;
                  sVar56 = auVar30._12_2_;
                  sVar24 = auVar29._12_2_;
                  sVar54 = auVar29._14_2_;
                  uVar71 = (ushort)(sVar24 < sVar56) * sVar56 | (ushort)(sVar24 >= sVar56) * sVar24;
                  sVar56 = auVar30._14_2_;
                  uVar72 = (ushort)(sVar54 < sVar56) * sVar56 | (ushort)(sVar54 >= sVar56) * sVar54;
                  sVar56 = auVar64._0_2_;
                  uVar55 = (sVar56 < (short)uVar65) * uVar65 |
                           (ushort)(sVar56 >= (short)uVar65) * sVar56;
                  sVar56 = auVar64._2_2_;
                  uVar59 = (sVar56 < (short)uVar66) * uVar66 |
                           (ushort)(sVar56 >= (short)uVar66) * sVar56;
                  sVar56 = auVar64._4_2_;
                  uVar60 = (sVar56 < (short)uVar67) * uVar67 |
                           (ushort)(sVar56 >= (short)uVar67) * sVar56;
                  sVar56 = auVar64._6_2_;
                  uVar61 = (sVar56 < (short)uVar68) * uVar68 |
                           (ushort)(sVar56 >= (short)uVar68) * sVar56;
                  auVar30._0_8_ = CONCAT26(uVar61,CONCAT24(uVar60,CONCAT22(uVar59,uVar55)));
                  sVar56 = auVar64._8_2_;
                  auVar30._8_2_ =
                       (sVar56 < (short)uVar69) * uVar69 |
                       (ushort)(sVar56 >= (short)uVar69) * sVar56;
                  sVar56 = auVar64._10_2_;
                  auVar30._10_2_ =
                       (sVar56 < (short)uVar70) * uVar70 |
                       (ushort)(sVar56 >= (short)uVar70) * sVar56;
                  sVar56 = auVar64._12_2_;
                  sVar24 = auVar64._14_2_;
                  auVar30._12_2_ =
                       (sVar56 < (short)uVar71) * uVar71 |
                       (ushort)(sVar56 >= (short)uVar71) * sVar56;
                  auVar30._14_2_ =
                       (sVar24 < (short)uVar72) * uVar72 |
                       (ushort)(sVar24 >= (short)uVar72) * sVar24;
                  puVar1 = (ushort *)((long)*b + lVar16);
                  *puVar1 = uVar65;
                  puVar1[1] = uVar66;
                  puVar1[2] = uVar67;
                  puVar1[3] = uVar68;
                  puVar1[4] = uVar69;
                  puVar1[5] = uVar70;
                  puVar1[6] = uVar71;
                  puVar1[7] = uVar72;
                  *(undefined1 (*) [16])((long)*ptr + lVar16) = auVar30;
                  lVar16 = lVar16 + 0x10;
                  auVar29 = auVar31;
                } while (lVar17 != lVar16);
                auVar57._0_8_ = auVar30._0_8_ << 0x10;
                auVar57._8_8_ = auVar30._8_8_ << 0x10 | (ulong)uVar61;
                auVar29 = paddsw((undefined1  [16])*ptr_00,auVar57);
                sVar56 = auVar29._0_2_;
                auVar64._0_2_ =
                     (ushort)((short)uVar22 < sVar56) * sVar56 | ((short)uVar22 >= sVar56) * uVar22;
                sVar56 = auVar29._2_2_;
                auVar64._2_2_ =
                     (ushort)((short)uVar41 < sVar56) * sVar56 | ((short)uVar41 >= sVar56) * uVar41;
                sVar56 = auVar29._4_2_;
                auVar64._4_2_ =
                     (ushort)((short)uVar44 < sVar56) * sVar56 | ((short)uVar44 >= sVar56) * uVar44;
                sVar56 = auVar29._6_2_;
                auVar64._6_2_ =
                     (ushort)((short)uVar47 < sVar56) * sVar56 | ((short)uVar47 >= sVar56) * uVar47;
                sVar56 = auVar29._8_2_;
                auVar64._8_2_ =
                     (ushort)((short)uVar50 < sVar56) * sVar56 | ((short)uVar50 >= sVar56) * uVar50;
                sVar56 = auVar29._10_2_;
                auVar64._10_2_ =
                     (ushort)((short)uVar51 < sVar56) * sVar56 | ((short)uVar51 >= sVar56) * uVar51;
                sVar56 = auVar29._12_2_;
                auVar64._12_2_ =
                     (ushort)((short)uVar52 < sVar56) * sVar56 | ((short)uVar52 >= sVar56) * uVar52;
                sVar56 = auVar29._14_2_;
                auVar64._14_2_ =
                     (ushort)((short)uVar53 < sVar56) * sVar56 | ((short)uVar53 >= sVar56) * uVar53;
                iVar12 = 6;
                do {
                  auVar34._0_8_ = auVar64._0_8_ << 0x10;
                  auVar34._8_8_ = auVar64._8_8_ << 0x10 | auVar64._0_8_ >> 0x30;
                  auVar29 = paddsw(auVar34,auVar32);
                  sVar56 = auVar64._0_2_;
                  sVar23 = auVar29._0_2_;
                  sVar24 = auVar64._2_2_;
                  sVar42 = auVar29._2_2_;
                  sVar54 = auVar64._4_2_;
                  sVar45 = auVar29._4_2_;
                  sVar5 = auVar64._6_2_;
                  sVar48 = auVar29._6_2_;
                  uVar22 = (ushort)(sVar48 < sVar5) * sVar5 | (ushort)(sVar48 >= sVar5) * sVar48;
                  auVar35._0_8_ =
                       CONCAT26(uVar22,CONCAT24((ushort)(sVar45 < sVar54) * sVar54 |
                                                (ushort)(sVar45 >= sVar54) * sVar45,
                                                CONCAT22((ushort)(sVar42 < sVar24) * sVar24 |
                                                         (ushort)(sVar42 >= sVar24) * sVar42,
                                                         (ushort)(sVar23 < sVar56) * sVar56 |
                                                         (ushort)(sVar23 >= sVar56) * sVar23)));
                  sVar56 = auVar64._8_2_;
                  sVar24 = auVar29._8_2_;
                  auVar35._8_2_ =
                       (ushort)(sVar24 < sVar56) * sVar56 | (ushort)(sVar24 >= sVar56) * sVar24;
                  sVar56 = auVar64._10_2_;
                  sVar24 = auVar29._10_2_;
                  auVar35._10_2_ =
                       (ushort)(sVar24 < sVar56) * sVar56 | (ushort)(sVar24 >= sVar56) * sVar24;
                  sVar56 = auVar64._12_2_;
                  sVar24 = auVar29._12_2_;
                  sVar54 = auVar29._14_2_;
                  auVar35._12_2_ =
                       (ushort)(sVar24 < sVar56) * sVar56 | (ushort)(sVar24 >= sVar56) * sVar24;
                  sVar56 = auVar64._14_2_;
                  auVar35._14_2_ =
                       (ushort)(sVar54 < sVar56) * sVar56 | (ushort)(sVar54 >= sVar56) * sVar54;
                  iVar12 = iVar12 + -1;
                  auVar64 = auVar35;
                } while (iVar12 != 0);
                auVar36._0_8_ = auVar35._0_8_ << 0x10;
                auVar36._8_8_ = auVar35._8_8_ << 0x10 | (ulong)uVar22;
                auVar37 = paddsw(auVar36,ZEXT416(uVar7));
                sVar56 = (-1 < (short)uVar55) * uVar55;
                sVar24 = (-1 < (short)uVar59) * uVar59;
                sVar54 = (-1 < auVar57._0_8_) * uVar60;
                sVar5 = (-1 < (short)uVar61) * uVar61;
                sVar23 = (-1 < (short)auVar30._8_2_) * auVar30._8_2_;
                sVar42 = (-1 < (short)auVar30._10_2_) * auVar30._10_2_;
                sVar45 = (-1 < (long)auVar57._8_8_) * auVar30._12_2_;
                sVar48 = auVar37._2_2_;
                auVar58._2_2_ =
                     (ushort)(sVar56 < sVar48) * sVar48 | (ushort)(sVar56 >= sVar48) * sVar56;
                auVar58._0_2_ = (ushort)(0 < auVar37._0_2_) * auVar37._0_2_;
                sVar56 = auVar37._4_2_;
                auVar58._4_2_ =
                     (ushort)(sVar24 < sVar56) * sVar56 | (ushort)(sVar24 >= sVar56) * sVar24;
                sVar56 = auVar37._6_2_;
                auVar58._6_2_ =
                     (ushort)(sVar54 < sVar56) * sVar56 | (ushort)(sVar54 >= sVar56) * sVar54;
                sVar56 = auVar37._8_2_;
                auVar58._8_2_ =
                     (ushort)(sVar5 < sVar56) * sVar56 | (ushort)(sVar5 >= sVar56) * sVar5;
                sVar56 = auVar37._10_2_;
                auVar58._10_2_ =
                     (ushort)(sVar23 < sVar56) * sVar56 | (ushort)(sVar23 >= sVar56) * sVar23;
                sVar56 = auVar37._12_2_;
                auVar58._12_2_ =
                     (ushort)(sVar42 < sVar56) * sVar56 | (ushort)(sVar42 >= sVar56) * sVar42;
                sVar56 = auVar37._14_2_;
                auVar58._14_2_ =
                     (ushort)(sVar45 < sVar56) * sVar56 | (ushort)(sVar45 >= sVar56) * sVar45;
                lVar16 = 0;
                do {
                  auVar29 = psubsw(auVar37,auVar28);
                  auVar30 = psubsw(auVar58,auVar73);
                  sVar56 = auVar30._0_2_;
                  sVar24 = auVar29._0_2_;
                  auVar37._0_2_ =
                       (ushort)(sVar24 < sVar56) * sVar56 | (ushort)(sVar24 >= sVar56) * sVar24;
                  sVar56 = auVar30._2_2_;
                  sVar24 = auVar29._2_2_;
                  auVar37._2_2_ =
                       (ushort)(sVar24 < sVar56) * sVar56 | (ushort)(sVar24 >= sVar56) * sVar24;
                  sVar56 = auVar30._4_2_;
                  sVar24 = auVar29._4_2_;
                  auVar37._4_2_ =
                       (ushort)(sVar24 < sVar56) * sVar56 | (ushort)(sVar24 >= sVar56) * sVar24;
                  sVar56 = auVar30._6_2_;
                  sVar24 = auVar29._6_2_;
                  auVar37._6_2_ =
                       (ushort)(sVar24 < sVar56) * sVar56 | (ushort)(sVar24 >= sVar56) * sVar24;
                  sVar56 = auVar30._8_2_;
                  sVar24 = auVar29._8_2_;
                  auVar37._8_2_ =
                       (ushort)(sVar24 < sVar56) * sVar56 | (ushort)(sVar24 >= sVar56) * sVar24;
                  sVar56 = auVar30._10_2_;
                  sVar24 = auVar29._10_2_;
                  auVar37._10_2_ =
                       (ushort)(sVar24 < sVar56) * sVar56 | (ushort)(sVar24 >= sVar56) * sVar24;
                  sVar56 = auVar30._12_2_;
                  sVar24 = auVar29._12_2_;
                  sVar54 = auVar29._14_2_;
                  auVar37._12_2_ =
                       (ushort)(sVar24 < sVar56) * sVar56 | (ushort)(sVar24 >= sVar56) * sVar24;
                  sVar56 = auVar30._14_2_;
                  auVar37._14_2_ =
                       (ushort)(sVar54 < sVar56) * sVar56 | (ushort)(sVar54 >= sVar56) * sVar54;
                  psVar2 = (short *)((long)*ptr + lVar16);
                  sVar56 = *psVar2;
                  sVar24 = psVar2[1];
                  sVar54 = psVar2[2];
                  sVar5 = psVar2[3];
                  sVar23 = psVar2[4];
                  sVar42 = psVar2[5];
                  sVar45 = psVar2[6];
                  sVar48 = psVar2[7];
                  uVar22 = (sVar56 < (short)auVar37._0_2_) * auVar37._0_2_ |
                           (ushort)(sVar56 >= (short)auVar37._0_2_) * sVar56;
                  uVar41 = (sVar24 < (short)auVar37._2_2_) * auVar37._2_2_ |
                           (ushort)(sVar24 >= (short)auVar37._2_2_) * sVar24;
                  uVar44 = (sVar54 < (short)auVar37._4_2_) * auVar37._4_2_ |
                           (ushort)(sVar54 >= (short)auVar37._4_2_) * sVar54;
                  uVar47 = (sVar5 < (short)auVar37._6_2_) * auVar37._6_2_ |
                           (ushort)(sVar5 >= (short)auVar37._6_2_) * sVar5;
                  uVar50 = (sVar23 < (short)auVar37._8_2_) * auVar37._8_2_ |
                           (ushort)(sVar23 >= (short)auVar37._8_2_) * sVar23;
                  uVar51 = (sVar42 < (short)auVar37._10_2_) * auVar37._10_2_ |
                           (ushort)(sVar42 >= (short)auVar37._10_2_) * sVar42;
                  uVar52 = (sVar45 < (short)auVar37._12_2_) * auVar37._12_2_ |
                           (ushort)(sVar45 >= (short)auVar37._12_2_) * sVar45;
                  uVar53 = (sVar48 < (short)auVar37._14_2_) * auVar37._14_2_ |
                           (ushort)(sVar48 >= (short)auVar37._14_2_) * sVar48;
                  sVar23 = (-1 < (short)uVar22) * uVar22;
                  sVar48 = (-1 < (short)uVar41) * uVar41;
                  auVar58._2_2_ = sVar48;
                  auVar58._0_2_ = sVar23;
                  sVar5 = (-1 < (short)uVar44) * uVar44;
                  auVar58._4_2_ = sVar5;
                  sVar56 = (-1 < (short)uVar47) * uVar47;
                  auVar58._6_2_ = sVar56;
                  sVar24 = (-1 < (short)uVar50) * uVar50;
                  auVar58._8_2_ = sVar24;
                  sVar54 = (-1 < (short)uVar51) * uVar51;
                  auVar58._10_2_ = sVar54;
                  sVar42 = (-1 < (short)uVar52) * uVar52;
                  auVar58._12_2_ = sVar42;
                  sVar45 = (-1 < (short)uVar53) * uVar53;
                  auVar58._14_2_ = sVar45;
                  *(undefined1 (*) [16])((long)*b_00 + lVar16) = auVar58;
                  uVar83 = (ushort)(sVar23 < (short)uVar83) * sVar23 |
                           (sVar23 >= (short)uVar83) * uVar83;
                  uVar84 = (ushort)(sVar48 < (short)uVar84) * sVar48 |
                           (sVar48 >= (short)uVar84) * uVar84;
                  uVar85 = (ushort)(sVar5 < (short)uVar85) * sVar5 |
                           (sVar5 >= (short)uVar85) * uVar85;
                  uVar86 = (ushort)(sVar56 < (short)uVar86) * sVar56 |
                           (sVar56 >= (short)uVar86) * uVar86;
                  uVar87 = (ushort)(sVar24 < (short)uVar87) * sVar24 |
                           (sVar24 >= (short)uVar87) * uVar87;
                  uVar88 = (ushort)(sVar54 < (short)uVar88) * sVar54 |
                           (sVar54 >= (short)uVar88) * uVar88;
                  uVar89 = (ushort)(sVar42 < (short)uVar89) * sVar42 |
                           (sVar42 >= (short)uVar89) * uVar89;
                  uVar90 = (ushort)(sVar45 < (short)uVar90) * sVar45 |
                           (sVar45 >= (short)uVar90) * uVar90;
                  uVar74 = (ushort)((short)uVar74 < sVar23) * sVar23 |
                           ((short)uVar74 >= sVar23) * uVar74;
                  uVar76 = (ushort)((short)uVar76 < sVar48) * sVar48 |
                           ((short)uVar76 >= sVar48) * uVar76;
                  uVar77 = (ushort)((short)uVar77 < sVar5) * sVar5 |
                           ((short)uVar77 >= sVar5) * uVar77;
                  uVar78 = (ushort)((short)uVar78 < sVar56) * sVar56 |
                           ((short)uVar78 >= sVar56) * uVar78;
                  uVar79 = (ushort)((short)uVar79 < sVar24) * sVar24 |
                           ((short)uVar79 >= sVar24) * uVar79;
                  uVar80 = (ushort)((short)uVar80 < sVar54) * sVar54 |
                           ((short)uVar80 >= sVar54) * uVar80;
                  uVar81 = (ushort)((short)uVar81 < sVar42) * sVar42 |
                           ((short)uVar81 >= sVar42) * uVar81;
                  uVar82 = (ushort)((short)uVar82 < sVar45) * sVar45 |
                           ((short)uVar82 >= sVar45) * uVar82;
                  uVar91 = (ushort)((short)uVar91 < sVar23) * sVar23 |
                           ((short)uVar91 >= sVar23) * uVar91;
                  uVar92 = (ushort)((short)uVar92 < sVar48) * sVar48 |
                           ((short)uVar92 >= sVar48) * uVar92;
                  uVar93 = (ushort)((short)uVar93 < sVar5) * sVar5 |
                           ((short)uVar93 >= sVar5) * uVar93;
                  uVar94 = (ushort)((short)uVar94 < sVar56) * sVar56 |
                           ((short)uVar94 >= sVar56) * uVar94;
                  uVar95 = (ushort)((short)uVar95 < sVar24) * sVar24 |
                           ((short)uVar95 >= sVar24) * uVar95;
                  uVar96 = (ushort)((short)uVar96 < sVar54) * sVar54 |
                           ((short)uVar96 >= sVar54) * uVar96;
                  uVar97 = (ushort)((short)uVar97 < sVar42) * sVar42 |
                           ((short)uVar97 >= sVar42) * uVar97;
                  uVar98 = (ushort)((short)uVar98 < sVar45) * sVar45 |
                           ((short)uVar98 >= sVar45) * uVar98;
                  lVar16 = lVar16 + 0x10;
                } while (lVar17 != lVar16);
                auVar38._0_2_ = -(ushort)((short)local_108 < (short)uVar91);
                auVar38._2_2_ = -(ushort)((short)uStack_106 < (short)uVar92);
                auVar38._4_2_ = -(ushort)((short)uVar25 < (short)uVar93);
                auVar38._6_2_ = -(ushort)((short)uVar43 < (short)uVar94);
                auVar38._8_2_ = -(ushort)((short)uVar46 < (short)uVar95);
                auVar38._10_2_ = -(ushort)((short)uVar49 < (short)uVar96);
                auVar38._12_2_ = -(ushort)((short)uVar62 < (short)uVar97);
                auVar38._14_2_ = -(ushort)((short)uVar63 < (short)uVar98);
                if ((((((((((((((((auVar38 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                                 (auVar38 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                                || (auVar38 >> 0x17 & (undefined1  [16])0x1) !=
                                   (undefined1  [16])0x0) ||
                               (auVar38 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                              || (auVar38 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                             || (auVar38 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                            || (auVar38 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                           || (auVar38 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar38 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar38 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar38 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar38 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar38 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar38 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar38._14_2_ >> 7 & 1) != 0) || (auVar38._14_2_ & 0x8000) != 0) {
                  uVar25 = ((short)uVar95 < (short)uVar91) * uVar91 |
                           ((short)uVar95 >= (short)uVar91) * uVar95;
                  uVar43 = ((short)uVar96 < (short)uVar92) * uVar92 |
                           ((short)uVar96 >= (short)uVar92) * uVar96;
                  uVar46 = ((short)uVar97 < (short)uVar93) * uVar93 |
                           ((short)uVar97 >= (short)uVar93) * uVar97;
                  uVar49 = ((short)uVar98 < (short)uVar94) * uVar94 |
                           ((short)uVar98 >= (short)uVar94) * uVar98;
                  sVar56 = (0 < (short)uVar95) * uVar95;
                  sVar24 = (0 < (short)uVar96) * uVar96;
                  sVar5 = (0 < (short)uVar97) * uVar97;
                  sVar54 = (0 < (short)uVar98) * uVar98;
                  uVar25 = ((short)uVar46 < (short)uVar25) * uVar25 |
                           ((short)uVar46 >= (short)uVar25) * uVar46;
                  uVar43 = ((short)uVar49 < (short)uVar43) * uVar43 |
                           ((short)uVar49 >= (short)uVar43) * uVar49;
                  uVar46 = (sVar56 < (short)uVar46) * uVar46 |
                           (ushort)(sVar56 >= (short)uVar46) * sVar56;
                  uVar49 = (sVar24 < (short)uVar49) * uVar49 |
                           (ushort)(sVar24 >= (short)uVar49) * sVar24;
                  uVar62 = (ushort)(sVar5 < sVar56) * sVar56 | (ushort)(sVar5 >= sVar56) * sVar5;
                  uVar63 = (ushort)(sVar54 < sVar24) * sVar24 | (ushort)(sVar54 >= sVar24) * sVar54;
                  sVar5 = (ushort)(0 < sVar5) * sVar5;
                  sVar54 = (ushort)(0 < sVar54) * sVar54;
                  auVar39._0_4_ =
                       CONCAT22(((short)uVar46 < (short)uVar43) * uVar43 |
                                ((short)uVar46 >= (short)uVar43) * uVar46,
                                ((short)uVar43 < (short)uVar25) * uVar25 |
                                ((short)uVar43 >= (short)uVar25) * uVar43);
                  auVar39._4_2_ =
                       ((short)uVar49 < (short)uVar46) * uVar46 |
                       ((short)uVar49 >= (short)uVar46) * uVar49;
                  auVar39._6_2_ =
                       ((short)uVar62 < (short)uVar49) * uVar49 |
                       ((short)uVar62 >= (short)uVar49) * uVar62;
                  auVar39._8_2_ =
                       ((short)uVar63 < (short)uVar62) * uVar62 |
                       ((short)uVar63 >= (short)uVar62) * uVar63;
                  auVar39._10_2_ =
                       (sVar5 < (short)uVar63) * uVar63 | (ushort)(sVar5 >= (short)uVar63) * sVar5;
                  auVar39._12_2_ =
                       (ushort)(sVar54 < sVar5) * sVar5 | (ushort)(sVar54 >= sVar5) * sVar54;
                  auVar39._14_2_ = (ushort)(0 < sVar54) * sVar54;
                  auVar28 = pshuflw(auVar39,auVar39,0);
                  memcpy(__dest,b_00,uVar20 << 4);
                  local_108 = auVar28._0_2_;
                  uStack_106 = auVar28._2_2_;
                  uVar10 = uVar21 & 0xffffffff;
                  uVar25 = local_108;
                  uVar43 = uStack_106;
                  uVar46 = local_108;
                  uVar49 = uStack_106;
                  uVar62 = local_108;
                  uVar63 = uStack_106;
                  local_144 = auVar39._0_4_;
                }
                iVar12 = (int)uVar10;
                uVar21 = uVar21 + 1;
              } while (uVar21 != uVar14);
              sVar56 = (short)local_144;
              if ((uVar8 + 7 & 0x7ffffff8) != 0) {
                uVar20 = 0;
                do {
                  if ((*(short *)((long)*__dest + uVar20 * 2) == sVar56) &&
                     (uVar18 = ((uint)uVar20 & 7) * uVar19 + ((uint)(uVar20 >> 3) & 0x1fffffff),
                     (int)uVar18 < (int)uVar8)) {
                    uVar8 = (ulong)uVar18;
                  }
                  uVar18 = (uint)uVar8;
                  uVar20 = uVar20 + 1;
                } while ((uVar19 & 0xfffffff) << 3 != (int)uVar20);
              }
              auVar40._0_2_ = -(ushort)((short)uVar83 < (short)local_118);
              auVar40._2_2_ = -(ushort)((short)uVar84 < (short)uStack_116);
              auVar40._4_2_ = -(ushort)((short)uVar85 < (short)local_118);
              auVar40._6_2_ = -(ushort)((short)uVar86 < (short)uStack_116);
              auVar40._8_2_ = -(ushort)((short)uVar87 < (short)local_118);
              auVar40._10_2_ = -(ushort)((short)uVar88 < (short)uStack_116);
              auVar40._12_2_ = -(ushort)((short)uVar89 < (short)local_118);
              auVar40._14_2_ = -(ushort)((short)uVar90 < (short)uStack_116);
              auVar75._0_2_ = -(ushort)((short)local_88 < (short)uVar74);
              auVar75._2_2_ = -(ushort)((short)uStack_86 < (short)uVar76);
              auVar75._4_2_ = -(ushort)((short)local_88 < (short)uVar77);
              auVar75._6_2_ = -(ushort)((short)uStack_86 < (short)uVar78);
              auVar75._8_2_ = -(ushort)((short)local_88 < (short)uVar79);
              auVar75._10_2_ = -(ushort)((short)uStack_86 < (short)uVar80);
              auVar75._12_2_ = -(ushort)((short)local_88 < (short)uVar81);
              auVar75._14_2_ = -(ushort)((short)uStack_86 < (short)uVar82);
              auVar75 = auVar75 | auVar40;
              if ((((((((((((((((auVar75 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                               (auVar75 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                              (auVar75 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                             (auVar75 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar75 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar75 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar75 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar75 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar75 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar75 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar75 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar75 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar75 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar75 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar75 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar75[0xf] < '\0') {
                *(byte *)&ppVar9->flag = (byte)ppVar9->flag | 0x40;
                sVar56 = 0;
                iVar12 = 0;
                uVar18 = 0;
              }
              ppVar9->score = (int)sVar56;
              ppVar9->end_query = uVar18;
              ppVar9->end_ref = iVar12;
              parasail_free(ptr_00);
              parasail_free(__dest);
              parasail_free(b_00);
              parasail_free(ptr);
              parasail_free(b);
              return ppVar9;
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
#ifdef PARASAIL_ROWCOL
    int32_t offset = 0;
    int32_t position = 0;
#endif
    __m128i* restrict pvP = NULL;
    __m128i* restrict pvE = NULL;
    __m128i* restrict pvHt = NULL;
    __m128i* restrict pvH = NULL;
    __m128i* restrict pvHMax = NULL;
    __m128i* restrict pvGapper = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    __m128i vZero;
    int16_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vMaxH;
    __m128i vMaxHUnit;
    __m128i vNegInfFront;
    __m128i vSegLenXgap;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile16.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    s1Len = profile->s1Len;
    matrix = profile->matrix;
    segWidth = 8; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
#ifdef PARASAIL_ROWCOL
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
#endif
    pvP = (__m128i*)profile->profile16.score;
    vGapO = _mm_set1_epi16(open);
    vGapE = _mm_set1_epi16(gap);
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vMaxHUnit = vNegLimit;
    vNegInfFront = vZero;
    vNegInfFront = _mm_insert_epi16(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm_adds_epi16(vNegInfFront,
            _mm_slli_si128(_mm_set1_epi16(-segLen*gap), 2));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE = parasail_memalign___m128i(16, segLen);
    pvHt= parasail_memalign___m128i(16, segLen);
    pvH = parasail_memalign___m128i(16, segLen);
    pvHMax = parasail_memalign___m128i(16, segLen);
    pvGapper = parasail_memalign___m128i(16, segLen);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!pvHt) return NULL;
    if (!pvH) return NULL;
    if (!pvHMax) return NULL;
    if (!pvGapper) return NULL;

    parasail_memset___m128i(pvH, vZero, segLen);
    parasail_memset___m128i(pvE, vNegLimit, segLen);
    {
        __m128i vGapper = _mm_subs_epi16(vZero,vGapO);
        for (i=segLen-1; i>=0; --i) {
            _mm_store_si128(pvGapper+i, vGapper);
            vGapper = _mm_subs_epi16(vGapper, vGapE);
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vHt;
        __m128i vF;
        __m128i vH;
        __m128i vHp;
        __m128i *pvW;
        __m128i vW;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm_load_si128(pvH+(segLen-1));
        vHp = _mm_slli_si128(vHp, 2);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = vZero;
        vF = vNegLimit;
        for (i=0; i<segLen; ++i) {
            vH = _mm_load_si128(pvH+i);
            vE = _mm_load_si128(pvE+i);
            vW = _mm_load_si128(pvW+i);
            vE = _mm_max_epi16(
                    _mm_subs_epi16(vE, vGapE),
                    _mm_subs_epi16(vH, vGapO));
            vHp = _mm_adds_epi16(vHp, vW);
            vF = _mm_max_epi16(vF, _mm_adds_epi16(vHt, pvGapper[i]));
            vHt = _mm_max_epi16(vE, vHp);
            _mm_store_si128(pvE+i, vE);
            _mm_store_si128(pvHt+i, vHt);
            vHp = vH;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm_slli_si128(vHt, 2);
        vF = _mm_max_epi16(vF, _mm_adds_epi16(vHt, pvGapper[0]));
        for (i=0; i<segWidth-2; ++i) {
            __m128i vFt = _mm_slli_si128(vF, 2);
            vFt = _mm_adds_epi16(vFt, vSegLenXgap);
            vF = _mm_max_epi16(vF, vFt);
        }

        /* calculate final H */
        vF = _mm_slli_si128(vF, 2);
        vF = _mm_adds_epi16(vF, vNegInfFront);
        vH = _mm_max_epi16(vHt, vF);
        vH = _mm_max_epi16(vH, vZero);
        for (i=0; i<segLen; ++i) {
            vHt = _mm_load_si128(pvHt+i);
            vF = _mm_max_epi16(
                    _mm_subs_epi16(vF, vGapE),
                    _mm_subs_epi16(vH, vGapO));
            vH = _mm_max_epi16(vHt, vF);
            vH = _mm_max_epi16(vH, vZero);
            _mm_store_si128(pvH+i, vH);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
            vMaxH = _mm_max_epi16(vH, vMaxH);
        } 

        {
            __m128i vCompare = _mm_cmpgt_epi16(vMaxH, vMaxHUnit);
            if (_mm_movemask_epi8(vCompare)) {
                score = _mm_hmax_epi16_rpl(vMaxH);
                vMaxHUnit = _mm_set1_epi16(score);
                end_ref = j;
                (void)memcpy(pvHMax, pvH, sizeof(__m128i)*segLen);
            }
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            int32_t k = 0;
            __m128i vH = _mm_load_si128(pvH + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 2);
            }
            result->rowcols->score_row[j] = (int16_t) _mm_extract_epi16 (vH, 7);
        }
#endif
    }

    /* Trace the alignment ending position on read. */
    {
        int16_t *t = (int16_t*)pvHMax;
        int32_t column_len = segLen * segWidth;
        end_query = s1Len;
        for (i = 0; i<column_len; ++i, ++t) {
            if (*t == score) {
                int32_t temp = i / segWidth + i % segWidth * segLen;
                if (temp < end_query) {
                    end_query = temp;
                }
            }
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvH+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi16(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvGapper);
    parasail_free(pvHMax);
    parasail_free(pvH);
    parasail_free(pvHt);
    parasail_free(pvE);

    return result;
}